

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtree.h
# Opt level: O0

void rtree_leaf_elm_szind_write(tsdn_t *tsdn,rtree_t *rtree,rtree_leaf_elm_t *elm,szind_t szind)

{
  void *pvVar1;
  void *result;
  uintptr_t bits;
  uintptr_t old_bits;
  szind_t szind_local;
  rtree_leaf_elm_t *elm_local;
  rtree_t *rtree_local;
  tsdn_t *tsdn_local;
  
  pvVar1 = (elm->le_bits).repr;
  (elm->le_bits).repr =
       (void *)((ulong)szind << 0x30 | (ulong)pvVar1 & 0xfffffffffffe | (ulong)((uint)pvVar1 & 1));
  return;
}

Assistant:

static inline void
rtree_leaf_elm_szind_write(tsdn_t *tsdn, rtree_t *rtree,
    rtree_leaf_elm_t *elm, szind_t szind) {
	assert(szind <= SC_NSIZES);

#ifdef RTREE_LEAF_COMPACT
	uintptr_t old_bits = rtree_leaf_elm_bits_read(tsdn, rtree, elm,
	    true);
	uintptr_t bits = ((uintptr_t)szind << LG_VADDR) |
	    ((uintptr_t)rtree_leaf_elm_bits_extent_get(old_bits) &
	    (((uintptr_t)0x1 << LG_VADDR) - 1)) |
	    ((uintptr_t)rtree_leaf_elm_bits_slab_get(old_bits));
	atomic_store_p(&elm->le_bits, (void *)bits, ATOMIC_RELEASE);
#else
	atomic_store_u(&elm->le_szind, szind, ATOMIC_RELEASE);
#endif
}